

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall UnitTests::Assert::Error(Assert *this,string *msg)

{
  char *pcVar1;
  TestFailure *this_00;
  allocator local_69;
  string local_68 [48];
  string local_38 [32];
  string *local_18;
  string *msg_local;
  Assert *this_local;
  
  local_18 = (string *)msg;
  msg_local = (string *)this;
  this_00 = (TestFailure *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string(local_38,local_18);
  pcVar1 = this->m_file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,pcVar1,&local_69);
  TestFailure::TestFailure(this_00,(string *)local_38,(string *)local_68,this->m_line);
  __cxa_throw(this_00,&TestFailure::typeinfo,TestFailure::~TestFailure);
}

Assistant:

[[noreturn]] void Error(const std::string& msg) const { throw TestFailure(msg, m_file, m_line); }